

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

bool __thiscall DepsLog::UpdateDeps(DepsLog *this,int out_id,Deps *deps)

{
  value_type pDVar1;
  Deps *this_00;
  size_type sVar2;
  reference ppDVar3;
  bool delete_old;
  Deps *deps_local;
  int out_id_local;
  DepsLog *this_local;
  
  sVar2 = std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::size(&this->deps_);
  if ((int)sVar2 <= out_id) {
    std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::resize
              (&this->deps_,(long)(out_id + 1));
  }
  ppDVar3 = std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::operator[]
                      (&this->deps_,(long)out_id);
  pDVar1 = *ppDVar3;
  if (pDVar1 != (value_type)0x0) {
    ppDVar3 = std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::operator[]
                        (&this->deps_,(long)out_id);
    this_00 = *ppDVar3;
    if (this_00 != (Deps *)0x0) {
      Deps::~Deps(this_00);
      operator_delete(this_00,0x18);
    }
  }
  ppDVar3 = std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::operator[]
                      (&this->deps_,(long)out_id);
  *ppDVar3 = deps;
  return pDVar1 != (value_type)0x0;
}

Assistant:

bool DepsLog::UpdateDeps(int out_id, Deps* deps) {
  if (out_id >= (int)deps_.size())
    deps_.resize(out_id + 1);

  bool delete_old = deps_[out_id] != NULL;
  if (delete_old)
    delete deps_[out_id];
  deps_[out_id] = deps;
  return delete_old;
}